

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_check_reserved_keys<char_const**>(string *key,char **val)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8);
  if (!bVar1) {
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x3a8,"general.alignment must be type u32");
}

Assistant:

static void gguf_check_reserved_keys(const std::string & key, const T val) {
    if (key == GGUF_KEY_GENERAL_ALIGNMENT) {
        if constexpr (std::is_same<T, uint32_t>::value) {
            GGML_ASSERT(val > 0 && (val & (val - 1)) == 0 && GGUF_KEY_GENERAL_ALIGNMENT " must be power of 2");
        } else {
            GGML_UNUSED(val);
            GGML_ABORT(GGUF_KEY_GENERAL_ALIGNMENT " must be type u32");
        }
    }
}